

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_tet_grad_nodes(REF_NODE ref_node,REF_INT *nodes,REF_DBL *scalar,REF_DBL *gradient)

{
  uint uVar1;
  double local_100;
  double local_f0;
  double local_e8;
  double local_d8;
  double local_d0;
  double local_c0;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT face [3];
  REF_DBL norm3 [3];
  double local_78;
  REF_DBL norm2 [3];
  double local_58;
  REF_DBL norm1 [3];
  double local_38;
  REF_DBL vol;
  REF_DBL *gradient_local;
  REF_DBL *scalar_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  *gradient = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;
  vol = (REF_DBL)gradient;
  gradient_local = scalar;
  scalar_local = (REF_DBL *)nodes;
  nodes_local = &ref_node->n;
  uVar1 = ref_node_tet_vol(ref_node,nodes,&local_38);
  if (uVar1 == 0) {
    local_38 = local_38 * -6.0;
    ref_private_macro_code_rss_1 = *(REF_STATUS *)scalar_local;
    ref_private_macro_code_rss = *(REF_STATUS *)((long)scalar_local + 0xc);
    face[0] = *(REF_INT *)(scalar_local + 1);
    uVar1 = ref_node_tri_normal((REF_NODE)nodes_local,&ref_private_macro_code_rss_1,&local_58);
    if (uVar1 == 0) {
      ref_private_macro_code_rss_1 = *(REF_STATUS *)scalar_local;
      ref_private_macro_code_rss = *(REF_STATUS *)((long)scalar_local + 4);
      face[0] = *(REF_INT *)((long)scalar_local + 0xc);
      uVar1 = ref_node_tri_normal((REF_NODE)nodes_local,&ref_private_macro_code_rss_1,&local_78);
      if (uVar1 == 0) {
        ref_private_macro_code_rss_1 = *(REF_STATUS *)scalar_local;
        ref_private_macro_code_rss = *(REF_STATUS *)(scalar_local + 1);
        face[0] = *(REF_INT *)((long)scalar_local + 4);
        ref_node_local._4_4_ =
             ref_node_tri_normal((REF_NODE)nodes_local,&ref_private_macro_code_rss_1,
                                 (REF_DBL *)(face + 1));
        if (ref_node_local._4_4_ == 0) {
          *(double *)vol =
               (gradient_local[*(int *)((long)scalar_local + 0xc)] -
               gradient_local[*(int *)scalar_local]) * (double)face._4_8_ +
               (gradient_local[*(int *)((long)scalar_local + 4)] -
               gradient_local[*(int *)scalar_local]) * local_58 +
               (gradient_local[*(int *)(scalar_local + 1)] - gradient_local[*(int *)scalar_local]) *
               local_78;
          *(double *)((long)vol + 8) =
               (gradient_local[*(int *)((long)scalar_local + 0xc)] -
               gradient_local[*(int *)scalar_local]) * norm3[0] +
               (gradient_local[*(int *)((long)scalar_local + 4)] -
               gradient_local[*(int *)scalar_local]) * norm1[0] +
               (gradient_local[*(int *)(scalar_local + 1)] - gradient_local[*(int *)scalar_local]) *
               norm2[0];
          *(double *)((long)vol + 0x10) =
               (gradient_local[*(int *)((long)scalar_local + 0xc)] -
               gradient_local[*(int *)scalar_local]) * norm3[1] +
               (gradient_local[*(int *)((long)scalar_local + 4)] -
               gradient_local[*(int *)scalar_local]) * norm1[1] +
               (gradient_local[*(int *)(scalar_local + 1)] - gradient_local[*(int *)scalar_local]) *
               norm2[1];
          if (local_38 * 1e+20 <= 0.0) {
            local_c0 = -(local_38 * 1e+20);
          }
          else {
            local_c0 = local_38 * 1e+20;
          }
          if (*(double *)vol <= 0.0) {
            local_d0 = -*(double *)vol;
          }
          else {
            local_d0 = *(double *)vol;
          }
          if (local_d0 < local_c0) {
            if (local_38 * 1e+20 <= 0.0) {
              local_d8 = -(local_38 * 1e+20);
            }
            else {
              local_d8 = local_38 * 1e+20;
            }
            if (*(double *)((long)vol + 8) <= 0.0) {
              local_e8 = -*(double *)((long)vol + 8);
            }
            else {
              local_e8 = *(double *)((long)vol + 8);
            }
            if (local_e8 < local_d8) {
              if (local_38 * 1e+20 <= 0.0) {
                local_f0 = -(local_38 * 1e+20);
              }
              else {
                local_f0 = local_38 * 1e+20;
              }
              if (*(double *)((long)vol + 0x10) <= 0.0) {
                local_100 = -*(double *)((long)vol + 0x10);
              }
              else {
                local_100 = *(double *)((long)vol + 0x10);
              }
              if (local_100 < local_f0) {
                *(double *)vol = *(double *)vol / local_38;
                *(double *)((long)vol + 8) = *(double *)((long)vol + 8) / local_38;
                *(double *)((long)vol + 0x10) = *(double *)((long)vol + 0x10) / local_38;
                return 0;
              }
            }
          }
          *(undefined8 *)vol = 0;
          *(undefined8 *)((long)vol + 8) = 0;
          *(undefined8 *)((long)vol + 0x10) = 0;
          ref_node_local._4_4_ = 4;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xcad,"ref_node_tet_grad_nodes",(ulong)ref_node_local._4_4_,"vol");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xca8,"ref_node_tet_grad_nodes",(ulong)uVar1,"vol");
        ref_node_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xca3,
             "ref_node_tet_grad_nodes",(ulong)uVar1,"vol");
      ref_node_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc9d,
           "ref_node_tet_grad_nodes",(ulong)uVar1,"vol");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_grad_nodes(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *scalar, REF_DBL *gradient) {
  REF_DBL vol, norm1[3], norm2[3], norm3[3];
  REF_INT face[3];

  gradient[0] = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;

  RSS(ref_node_tet_vol(ref_node, nodes, &vol), "vol");
  vol *= -6.0;

  face[0] = nodes[0];
  face[1] = nodes[3];
  face[2] = nodes[2];
  RSS(ref_node_tri_normal(ref_node, face, norm1), "vol");

  face[0] = nodes[0];
  face[1] = nodes[1];
  face[2] = nodes[3];
  RSS(ref_node_tri_normal(ref_node, face, norm2), "vol");

  face[0] = nodes[0];
  face[1] = nodes[2];
  face[2] = nodes[1];
  RSS(ref_node_tri_normal(ref_node, face, norm3), "vol");

  gradient[0] = (scalar[nodes[1]] - scalar[nodes[0]]) * norm1[0] +
                (scalar[nodes[2]] - scalar[nodes[0]]) * norm2[0] +
                (scalar[nodes[3]] - scalar[nodes[0]]) * norm3[0];
  gradient[1] = (scalar[nodes[1]] - scalar[nodes[0]]) * norm1[1] +
                (scalar[nodes[2]] - scalar[nodes[0]]) * norm2[1] +
                (scalar[nodes[3]] - scalar[nodes[0]]) * norm3[1];
  gradient[2] = (scalar[nodes[1]] - scalar[nodes[0]]) * norm1[2] +
                (scalar[nodes[2]] - scalar[nodes[0]]) * norm2[2] +
                (scalar[nodes[3]] - scalar[nodes[0]]) * norm3[2];

  if (ref_math_divisible(gradient[0], vol) &&
      ref_math_divisible(gradient[1], vol) &&
      ref_math_divisible(gradient[2], vol)) {
    gradient[0] /= vol;
    gradient[1] /= vol;
    gradient[2] /= vol;
  } else {
    gradient[0] = 0.0;
    gradient[1] = 0.0;
    gradient[2] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}